

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiString *pString)

{
  aiString *local_20;
  char *sz;
  aiString *pString_local;
  ValidateDSProcess *this_local;
  
  if (0x400 < pString->length) {
    ReportError(this,"aiString::length is too large (%u, maximum is %lu)",(ulong)pString->length,
                0x400);
  }
  for (local_20 = (aiString *)pString->data; (char)local_20->length != '\0';
      local_20 = (aiString *)((long)&local_20->length + 1)) {
    if (pString + 1 <= local_20) {
      ReportError(this,"aiString::data is invalid. There is no terminal character");
    }
  }
  if (pString->length != (int)local_20 - ((int)pString + 4)) {
    ReportError(this,"aiString::data is invalid: the terminal zero is at a wrong offset");
  }
  return;
}

Assistant:

void ValidateDSProcess::Validate( const aiString* pString)
{
    if (pString->length > MAXLEN)
    {
        ReportError("aiString::length is too large (%u, maximum is %lu)",
            pString->length,MAXLEN);
    }
    const char* sz = pString->data;
    while (true)
    {
        if ('\0' == *sz)
        {
            if (pString->length != (unsigned int)(sz-pString->data)) {
                ReportError("aiString::data is invalid: the terminal zero is at a wrong offset");
            }
            break;
        }
        else if (sz >= &pString->data[MAXLEN]) {
            ReportError("aiString::data is invalid. There is no terminal character");
        }
        ++sz;
    }
}